

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varmap.cc
# Opt level: O3

void __thiscall
ScopeLocal::makeNameRecommendationsForSymbols
          (ScopeLocal *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *resname,vector<Symbol_*,_std::allocator<Symbol_*>_> *ressym)

{
  pointer *pppSVar1;
  _Rb_tree_node_base *addr;
  _Rb_tree_color s;
  _Base_ptr p_Var2;
  iterator iVar3;
  bool bVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  HighVariable *pHVar7;
  _Base_ptr p_Var8;
  Varnode *this_00;
  VarnodeBank *this_01;
  _List_node_base *p_Var9;
  Symbol *sym_1;
  DynamicHash dhash;
  Symbol *local_e8;
  _Rb_tree_node_base *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  DynamicHash local_b8;
  
  p_Var8 = (this->nameRecommend)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_e0 = &(this->nameRecommend)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var8 != local_e0) {
    do {
      addr = p_Var8 + 1;
      s = p_Var8[2]._M_color;
      p_Var2 = p_Var8[1]._M_left;
      this_01 = &((this->super_ScopeInternal).super_Scope.fd)->vbank;
      if (p_Var2 == (_Base_ptr)0x0) {
        cVar5 = VarnodeBank::beginLoc(this_01,s,(Address *)addr);
        cVar6 = VarnodeBank::endLoc(&((this->super_ScopeInternal).super_Scope.fd)->vbank,s,
                                    (Address *)addr);
      }
      else {
        cVar5 = VarnodeBank::beginLoc
                          (this_01,s,(Address *)addr,(Address *)&p_Var8[1]._M_left,0xffffffff);
        cVar6 = VarnodeBank::endLoc(&((this->super_ScopeInternal).super_Scope.fd)->vbank,s,
                                    (Address *)addr,(Address *)&p_Var8[1]._M_left,0xffffffff);
      }
      for (; cVar5._M_node != cVar6._M_node;
          cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node)) {
        if (((*(Varnode **)(cVar5._M_node + 1))->flags & 4) == 0) {
          pHVar7 = Varnode::getHigh(*(Varnode **)(cVar5._M_node + 1));
          local_b8._0_8_ = pHVar7->symbol;
          if (((Symbol *)local_b8._0_8_ != (Symbol *)0x0) &&
             (bVar4 = Symbol::isNameUndefined((Symbol *)local_b8._0_8_), bVar4)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(resname,(value_type *)&p_Var8[2]._M_parent);
            iVar3._M_current =
                 (ressym->super__Vector_base<Symbol_*,_std::allocator<Symbol_*>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (ressym->super__Vector_base<Symbol_*,_std::allocator<Symbol_*>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<Symbol*,std::allocator<Symbol*>>::_M_realloc_insert<Symbol*const&>
                        ((vector<Symbol*,std::allocator<Symbol*>> *)ressym,iVar3,
                         (Symbol **)&local_b8);
            }
            else {
              *iVar3._M_current = (Symbol *)local_b8._0_8_;
              pppSVar1 = &(ressym->super__Vector_base<Symbol_*,_std::allocator<Symbol_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppSVar1 = *pppSVar1 + 1;
            }
            break;
          }
        }
        if (p_Var2 == (_Base_ptr)0x0) break;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != local_e0);
  }
  p_Var9 = (this->dynRecommend).
           super__List_base<DynamicRecommend,_std::allocator<DynamicRecommend>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)&this->dynRecommend) {
    local_b8.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.addrresult.base = (AddrSpace *)0x0;
    do {
      DynamicHash::clear(&local_b8);
      this_00 = DynamicHash::findVarnode
                          (&local_b8,(this->super_ScopeInternal).super_Scope.fd,
                           (Address *)(p_Var9 + 1),(uint8)p_Var9[2]._M_next);
      if ((this_00 != (Varnode *)0x0) && ((this_00->flags & 4) == 0)) {
        pHVar7 = Varnode::getHigh(this_00);
        local_e8 = pHVar7->symbol;
        if ((local_e8 != (Symbol *)0x0) && (bVar4 = Symbol::isNameUndefined(local_e8), bVar4)) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,p_Var9[2]._M_prev,
                     (long)&(p_Var9[2]._M_prev)->_M_next + (long)p_Var9[3]._M_next);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)resname,
                     &local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          iVar3._M_current =
               (ressym->super__Vector_base<Symbol_*,_std::allocator<Symbol_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (ressym->super__Vector_base<Symbol_*,_std::allocator<Symbol_*>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Symbol*,std::allocator<Symbol*>>::_M_realloc_insert<Symbol*const&>
                      ((vector<Symbol*,std::allocator<Symbol*>> *)ressym,iVar3,&local_e8);
          }
          else {
            *iVar3._M_current = local_e8;
            pppSVar1 = &(ressym->super__Vector_base<Symbol_*,_std::allocator<Symbol_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + 1;
          }
        }
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)&this->dynRecommend);
    if (local_b8.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.opedge.super__Vector_base<ToOpEdge,_std::allocator<ToOpEdge>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_b8.vnedge.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.vnedge.
                      super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8.markvn.super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.markvn.
                      super__Vector_base<const_Varnode_*,_std::allocator<const_Varnode_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8.markop.super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.markop.
                      super__Vector_base<const_PcodeOp_*,_std::allocator<const_PcodeOp_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void ScopeLocal::makeNameRecommendationsForSymbols(vector<string> &resname,vector<Symbol *> &ressym) const

{ 				// Find nameable symbols with a varnode rep matching a name recommendation
  map<AddressUsePointPair,string>::const_iterator iter;
  for(iter=nameRecommend.begin();iter!=nameRecommend.end();++iter) {
    VarnodeLocSet::const_iterator biter,eiter;
    bool isaddrtied;
    const Address &addr((*iter).first.getAddr());
    const Address &useaddr((*iter).first.getUseAddr());
    int4 size = (*iter).first.getSize();
    if (useaddr.isInvalid()) {
      isaddrtied = true;
      biter = fd->beginLoc(size,addr);
      eiter = fd->endLoc(size,addr);
    }
    else {
      isaddrtied = false;
      biter = fd->beginLoc(size,addr,useaddr);
      eiter = fd->endLoc(size,addr,useaddr);
    }
    while(biter != eiter) {
      Varnode *vn = *biter;
      if (!vn->isAnnotation()) {
	Symbol *sym = vn->getHigh()->getSymbol();
	if (sym != (Symbol *)0) {
	  if (sym->isNameUndefined()) {
	    resname.push_back( (*iter).second);
	    ressym.push_back(sym);
	    break;
	  }
	}
      }
      if (isaddrtied) break;
      ++biter;
    }
  }

  if (dynRecommend.empty()) return;

  list<DynamicRecommend>::const_iterator dyniter;
  DynamicHash dhash;
  for(dyniter=dynRecommend.begin();dyniter!=dynRecommend.end();++dyniter) {
    dhash.clear();
    const DynamicRecommend &dynEntry(*dyniter);
    Varnode *vn = dhash.findVarnode(fd, dynEntry.getAddress(), dynEntry.getHash());
    if (vn == (Varnode *)0) continue;
    if (vn->isAnnotation()) continue;
    Symbol *sym = vn->getHigh()->getSymbol();
    if (sym != (Symbol *)0) {
      if (sym->isNameUndefined()) {
	resname.push_back( dynEntry.getName() );
	ressym.push_back(sym);
      }
    }
  }
}